

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

_Bool sx_semaphore_wait(sx_sem *sem,int msecs)

{
  code *pcVar1;
  undefined1 uVar2;
  int iVar3;
  _Bool _Var4;
  timespec ts;
  timespec local_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)sem);
  if (iVar3 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x1bf,"r == 0");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (msecs == -1) {
    iVar3 = 0;
    while (iVar3 == 0) {
      iVar3 = *(int *)(sem->data + 0x58);
      if (0 < iVar3) goto LAB_0010bd55;
      iVar3 = pthread_cond_wait((pthread_cond_t *)(sem->data + 0x28),(pthread_mutex_t *)sem);
    }
  }
  else {
    clock_gettime(0,&local_30);
    local_30.tv_nsec = (long)msecs * 1000000 + local_30.tv_nsec + local_30.tv_sec * 1000000000;
    local_30.tv_sec = (ulong)local_30.tv_nsec / 1000000000;
    local_30.tv_nsec = (ulong)local_30.tv_nsec % 1000000000;
    iVar3 = 0;
    while (iVar3 == 0) {
      iVar3 = *(int *)(sem->data + 0x58);
      if (0 < iVar3) goto LAB_0010bd55;
      iVar3 = pthread_cond_timedwait
                        ((pthread_cond_t *)(sem->data + 0x28),(pthread_mutex_t *)sem,&local_30);
    }
  }
  _Var4 = false;
LAB_0010bd5d:
  pthread_mutex_unlock((pthread_mutex_t *)sem);
  return _Var4;
LAB_0010bd55:
  *(int *)(sem->data + 0x58) = iVar3 + -1;
  _Var4 = true;
  goto LAB_0010bd5d;
}

Assistant:

bool sx_semaphore_wait(sx_sem* sem, int msecs)
{
    sx__sem* _sem = (sx__sem*)sem->data;
    int r = pthread_mutex_lock(&_sem->mutex);
    sx_assert(r == 0);

    if (msecs == -1) {
        while (r == 0 && _sem->count <= 0) r = pthread_cond_wait(&_sem->cond, &_sem->mutex);
    } else {
        struct timespec ts;
        clock_gettime(CLOCK_REALTIME, &ts);
        sx__tm_add(&ts, msecs);
        while (r == 0 && _sem->count <= 0)
            r = pthread_cond_timedwait(&_sem->cond, &_sem->mutex, &ts);
    }

    bool ok = r == 0;
    if (ok) {
        --_sem->count;
    }
    r = pthread_mutex_unlock(&_sem->mutex);
    sx_unused(r);
    return ok;
}